

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regr_slope.hpp
# Opt level: O1

void duckdb::RegrSlopeOperation::Finalize<double,duckdb::RegrSlopeState>
               (RegrSlopeState *state,double *target,AggregateFinalizeData *finalize_data)

{
  double dVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  char cVar4;
  OutOfRangeException *this;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  uVar2 = (state->cov_pop).count;
  if ((uVar2 == 0) || (uVar3 = (state->var_pop).count, uVar3 == 0)) {
    AggregateFinalizeData::ReturnNull(finalize_data);
    return;
  }
  dVar5 = 0.0;
  if (uVar3 != 1) {
    auVar7._8_4_ = (int)(uVar3 >> 0x20);
    auVar7._0_8_ = uVar3;
    auVar7._12_4_ = 0x45300000;
    dVar5 = (state->var_pop).dsquared /
            ((auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
  }
  dVar1 = (state->cov_pop).co_moment;
  cVar4 = duckdb::Value::DoubleIsFinite(dVar5);
  if (cVar4 != '\0') {
    auVar6._8_4_ = (int)(uVar2 >> 0x20);
    auVar6._0_8_ = uVar2;
    auVar6._12_4_ = 0x45300000;
    *target = (double)(~-(ulong)(dVar5 != 0.0) & 0x7ff8000000000000 |
                      (ulong)((dVar1 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                                       ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0
                                       ))) / dVar5) & -(ulong)(dVar5 != 0.0));
    return;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"VARPOP is out of range!","");
  duckdb::OutOfRangeException::OutOfRangeException(this,(string *)local_40);
  __cxa_throw(this,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.cov_pop.count == 0 || state.var_pop.count == 0) {
			finalize_data.ReturnNull();
		} else {
			auto cov = state.cov_pop.co_moment / state.cov_pop.count;
			auto var_pop = state.var_pop.count > 1 ? (state.var_pop.dsquared / state.var_pop.count) : 0;
			if (!Value::DoubleIsFinite(var_pop)) {
				throw OutOfRangeException("VARPOP is out of range!");
			}
			target = var_pop != 0 ? cov / var_pop : NAN;
		}
	}